

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Abc_NtkRecAdd3(Abc_Ntk_t *pNtk,int fUseSOPB)

{
  Gia_Man_t *p;
  int iVar1;
  abctime aVar2;
  Abc_Ntk_t *pNtk_00;
  abctime aVar3;
  Lms_Man_t *pLVar4;
  If_Par_t Pars;
  
  aVar2 = Abc_Clock();
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    puts("Performing recoding structures with choices.");
  }
  pLVar4 = s_pMan3;
  s_pMan3->fLibConstr = 1;
  p = pLVar4->pGia;
  if ((p != (Gia_Man_t *)0x0) && (p->pHTable == (int *)0x0)) {
    Gia_ManHashStart(p);
    pLVar4 = s_pMan3;
  }
  memset(&Pars.nFlowIters,0,0x128);
  Pars.nLutSize = pLVar4->nVars;
  Pars.nCutsMax = pLVar4->nCuts;
  Pars.DelayTarget = -1.0;
  Pars.Epsilon = 0.005;
  Pars.fArea = 1;
  Pars.fCutMin = (int)(fUseSOPB == 0);
  Pars.fDelayOpt = (int)(fUseSOPB != 0);
  Pars.pFuncCost = (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0;
  Pars.pFuncUser = Abc_NtkRecAddCut3;
  Pars.fTruth = Pars.fArea;
  Pars.fUsePerm = Pars.fDelayOpt;
  pNtk_00 = Abc_NtkIf(pNtk,&Pars);
  Abc_NtkDelete(pNtk_00);
  aVar3 = Abc_Clock();
  s_pMan3->timeTotal = s_pMan3->timeTotal + (aVar3 - (int)aVar2);
  return;
}

Assistant:

void Abc_NtkRecAdd3( Abc_Ntk_t * pNtk, int fUseSOPB )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;
    int clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing recoding structures with choices.\n" );
    // remember that the manager was used for library construction
    s_pMan3->fLibConstr = 1;
    // create hash table if not available
    if ( s_pMan3->pGia && s_pMan3->pGia->pHTable == NULL )
        Gia_ManHashStart( s_pMan3->pGia );

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  s_pMan3->nVars;
    pPars->nCutsMax    =  s_pMan3->nCuts;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fArea       =  1;
    // internal parameters
    if ( fUseSOPB )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  0;
        pPars->fUsePerm    =  1; 
        pPars->fDelayOpt   =  1;
    }
    else
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fUsePerm    =  0; 
        pPars->fDelayOpt   =  0;
    }
    pPars->fSkipCutFilter = 0;
    pPars->pFuncCost   =  NULL;
    pPars->pFuncUser   =  Abc_NtkRecAddCut3;
    // perform recording
    pNtkNew = Abc_NtkIf( pNtk, pPars );
    Abc_NtkDelete( pNtkNew );
s_pMan3->timeTotal += Abc_Clock() - clk;
}